

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O1

void __thiscall cmCTestGIT::OneLineParser::~OneLineParser(OneLineParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00b3d268;
  pcVar2 = (this->super_LineParser).Line._M_dataplus._M_p;
  paVar1 = &(this->super_LineParser).Line.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

OneLineParser(cmCTestGIT* git, const char* prefix, std::string& l)
    : Line1(l)
  {
    this->SetLog(&git->Log, prefix);
  }